

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O2

int __thiscall
sptk::reaper::FdFilter::FilterStream(FdFilter *this,FILE *input_stream,FILE *output_stream)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  int16_t *piVar6;
  int16_t *piVar7;
  int iVar8;
  int towrite;
  FILE *local_38;
  
  iVar1 = this->max_input_;
  iVar8 = 1;
  local_38 = (FILE *)output_stream;
  iVar5 = iVar8;
  while( true ) {
    this->filter_state_ = iVar8;
    sVar4 = fread(this->input_buffer_,2,(long)iVar1,(FILE *)input_stream);
    iVar8 = (int)sVar4;
    if (iVar8 == 0) break;
    iVar2 = getc((FILE *)input_stream);
    iVar3 = feof((FILE *)input_stream);
    if (iVar3 == 0) {
      ungetc(iVar2,(FILE *)input_stream);
    }
    else {
      *(byte *)&this->filter_state_ = (byte)this->filter_state_ | 2;
    }
    iVar2 = this->insert_;
    if (1 < iVar2) {
      piVar6 = this->input_buffer_ + iVar8;
      piVar7 = this->input_buffer_ + iVar2 * iVar8;
      while (iVar3 = (int)sVar4, sVar4 = (size_t)(iVar3 - 1), iVar3 != 0) {
        piVar6 = piVar6 + -1;
        iVar3 = iVar2;
        while( true ) {
          iVar3 = iVar3 + -1;
          piVar7 = piVar7 + -1;
          if (iVar3 == 0) break;
          *piVar7 = 0;
        }
        *piVar7 = *piVar6;
      }
    }
    FilterBuffer(this,iVar2 * iVar8,&towrite);
    iVar2 = towrite;
    sVar4 = fwrite(this->output_buffer_,2,(long)towrite,local_38);
    iVar8 = 0;
    if ((int)sVar4 < iVar2) {
      fwrite("Problems writing output in FilterStream\n",0x28,1,_stderr);
      iVar8 = 0;
      iVar5 = iVar8;
    }
  }
  return iVar5;
}

Assistant:

int FdFilter::FilterStream(FILE *input_stream, FILE *output_stream) {
  int i, j;
  int  toread, towrite, nread, rVal = 1, testc;

  toread = max_input_;
  filter_state_ = 1;  // indicate start of new signal
  /* process data from a stream */
  while ((nread = fread(input_buffer_, sizeof(*input_buffer_), toread,
                        input_stream))) {
    testc = getc(input_stream);
    if (feof(input_stream))
      filter_state_ |= 2;
    else
      ungetc(testc, input_stream);
    if (insert_ > 1) {
      int16_t *p, *q;
      for (p = input_buffer_ + nread - 1,
               q = input_buffer_ + (nread * insert_) - 1, i = nread; i--;) {
        for (j = insert_ - 1; j--;) *q-- = 0;
        *q-- = *p--;
      }
    }
    FilterBuffer(nread*insert_, &towrite);
    if ((i = fwrite(output_buffer_, sizeof(*output_buffer_), towrite,
                    output_stream)) < towrite) {
      fprintf(stderr, "Problems writing output in FilterStream\n");
      rVal = 0;
    }
    filter_state_ = 0;
  }
  return(rVal);
}